

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O1

void __thiscall llvm::FoldingSetNodeID::AddString(FoldingSetNodeID *this,StringRef String)

{
  ulong uVar1;
  uint *in_start;
  uint uVar2;
  int iVar3;
  uint V;
  uint Size;
  uint V_1;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  uVar1 = String.Length;
  in_start = (uint *)String.Data;
  local_30 = (uint)String.Length;
  SmallVectorTemplateBase<unsigned_int,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&local_30);
  if (local_30 != 0) {
    if (((undefined1  [16])String & (undefined1  [16])0x3) == (undefined1  [16])0x0) {
      uVar2 = local_30 & 0xfffffffc;
      SmallVectorImpl<unsigned_int>::append<unsigned_int_const*,void>
                ((SmallVectorImpl<unsigned_int> *)this,in_start,
                 (uint *)((long)in_start + (ulong)uVar2));
      uVar2 = uVar2 + 4;
    }
    else {
      uVar2 = 4;
      if (3 < local_30) {
        uVar2 = 4;
        do {
          if ((((uVar1 <= uVar2 - 1) || (uVar1 <= uVar2 - 2)) || (uVar1 <= uVar2 - 3)) ||
             (uVar1 <= uVar2 - 4)) goto LAB_00182374;
          local_2c = (uint)*(byte *)((long)in_start + (ulong)(uVar2 - 4)) |
                     (uint)*(byte *)((long)in_start + (ulong)(uVar2 - 3)) << 8 |
                     (uint)*(byte *)((long)in_start + (ulong)(uVar2 - 2)) << 0x10 |
                     (uint)*(byte *)((long)in_start + (ulong)(uVar2 - 1)) << 0x18;
          SmallVectorTemplateBase<unsigned_int,_true>::push_back
                    ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&local_2c);
          uVar2 = uVar2 + 4;
        } while (uVar2 <= local_30);
      }
    }
    local_34 = 0;
    iVar3 = uVar2 - local_30;
    if (iVar3 != 3) {
      if (iVar3 != 2) {
        if (iVar3 != 1) {
          return;
        }
        if (uVar1 <= local_30 - 3) goto LAB_00182374;
        local_34 = (uint)*(byte *)((long)in_start + (ulong)(local_30 - 3));
      }
      if (uVar1 <= local_30 - 2) goto LAB_00182374;
      local_34 = (uint)*(byte *)((long)in_start + (ulong)(local_30 - 2)) | local_34 << 8;
    }
    if (uVar1 <= local_30 - 1) {
LAB_00182374:
      __assert_fail("Index < Length && \"Invalid index!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0xef,"char llvm::StringRef::operator[](size_t) const");
    }
    local_34 = (uint)*(byte *)((long)in_start + (ulong)(local_30 - 1)) | local_34 << 8;
    SmallVectorTemplateBase<unsigned_int,_true>::push_back
              ((SmallVectorTemplateBase<unsigned_int,_true> *)this,&local_34);
  }
  return;
}

Assistant:

void FoldingSetNodeID::AddString(StringRef String) {
  unsigned Size =  String.size();
  Bits.push_back(Size);
  if (!Size) return;

  unsigned Units = Size / 4;
  unsigned Pos = 0;
  const unsigned *Base = (const unsigned*) String.data();

  // If the string is aligned do a bulk transfer.
  if (!((intptr_t)Base & 3)) {
    Bits.append(Base, Base + Units);
    Pos = (Units + 1) * 4;
  } else {
    // Otherwise do it the hard way.
    // To be compatible with above bulk transfer, we need to take endianness
    // into account.
    static_assert(sys::IsBigEndianHost || sys::IsLittleEndianHost,
                  "Unexpected host endianness");
    if (sys::IsBigEndianHost) {
      for (Pos += 4; Pos <= Size; Pos += 4) {
        unsigned V = ((unsigned char)String[Pos - 4] << 24) |
                     ((unsigned char)String[Pos - 3] << 16) |
                     ((unsigned char)String[Pos - 2] << 8) |
                      (unsigned char)String[Pos - 1];
        Bits.push_back(V);
      }
    } else {  // Little-endian host
      for (Pos += 4; Pos <= Size; Pos += 4) {
        unsigned V = ((unsigned char)String[Pos - 1] << 24) |
                     ((unsigned char)String[Pos - 2] << 16) |
                     ((unsigned char)String[Pos - 3] << 8) |
                      (unsigned char)String[Pos - 4];
        Bits.push_back(V);
      }
    }
  }

  // With the leftover bits.
  unsigned V = 0;
  // Pos will have overshot size by 4 - #bytes left over.
  // No need to take endianness into account here - this is always executed.
  switch (Pos - Size) {
  case 1: V = (V << 8) | (unsigned char)String[Size - 3]; LLVM_FALLTHROUGH;
  case 2: V = (V << 8) | (unsigned char)String[Size - 2]; LLVM_FALLTHROUGH;
  case 3: V = (V << 8) | (unsigned char)String[Size - 1]; break;
  default: return; // Nothing left.
  }

  Bits.push_back(V);
}